

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid_x86.cpp
# Opt level: O0

int __thiscall
ncnn::HardSigmoid_x86::forward_inplace(HardSigmoid_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  float *pfVar2;
  long in_RSI;
  long *in_RDI;
  undefined1 auVar3 [16];
  int i_1;
  float *ptr_1;
  int q_1;
  __m128 _ans;
  __m128 _p;
  int i;
  __m128 _one;
  __m128 _zero;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  Mat local_260;
  float *local_218;
  int local_20c;
  undefined1 local_208 [8];
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  int local_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  Mat local_1a0;
  float *local_158;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a4;
  float *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  float *local_8;
  
  local_13c = *(int *)(in_RSI + 0x2c);
  local_140 = *(int *)(in_RSI + 0x30);
  local_144 = *(int *)(in_RSI + 0x38);
  local_148 = local_13c * local_140;
  local_14c = *(int *)(in_RSI + 0x18);
  if (local_14c == 4) {
    local_14c = 4;
    for (local_150 = 0; local_150 < local_144; local_150 = local_150 + 1) {
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                         (int)((ulong)in_RDI >> 0x20));
      pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_1a0);
      ncnn::Mat::~Mat((Mat *)0x8e97c6);
      local_a4 = 0;
      local_b8 = 0;
      uStack_b4 = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
      local_1c8 = 0;
      uStack_1c0 = 0;
      local_c8 = 0x3f800000;
      local_d8 = 0x3f800000;
      uStack_d4 = 0x3f800000;
      uStack_d0 = 0x3f800000;
      uStack_cc = 0x3f800000;
      local_1d8 = 0x3f8000003f800000;
      uStack_1d0 = 0x3f8000003f800000;
      local_158 = pfVar2;
      for (local_1dc = 0; local_1dc < local_148; local_1dc = local_1dc + 1) {
        local_a0 = local_158;
        local_1f8 = *(undefined8 *)local_158;
        uStack_1f0 = *(undefined8 *)(local_158 + 2);
        local_f8 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        local_98 = CONCAT44(local_f8,local_f8);
        uStack_90 = CONCAT44(local_f8,local_f8);
        local_118 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_78 = CONCAT44(local_118,local_118);
        uStack_70 = CONCAT44(local_118,local_118);
        local_68._0_4_ = (float)local_1f8;
        local_68._4_4_ = (float)((ulong)local_1f8 >> 0x20);
        uStack_60._0_4_ = (float)uStack_1f0;
        uStack_60._4_4_ = (float)((ulong)uStack_1f0 >> 0x20);
        local_88 = (float)local_68 * local_118;
        fStack_84 = local_68._4_4_ * local_118;
        fStack_80 = (float)uStack_60 * local_118;
        fStack_7c = uStack_60._4_4_ * local_118;
        local_208._4_4_ = fStack_84 + local_f8;
        local_208._0_4_ = local_88 + local_f8;
        uStack_200._0_4_ = fStack_80 + local_f8;
        uStack_200._4_4_ = fStack_7c + local_f8;
        local_48 = local_208;
        uStack_40 = uStack_200;
        auVar3._8_8_ = uStack_200;
        auVar3._0_8_ = local_208;
        auVar3 = maxps(auVar3,ZEXT816(0));
        local_208 = auVar3._0_8_;
        local_28 = local_208;
        uStack_200 = auVar3._8_8_;
        uStack_20 = uStack_200;
        auVar1._8_8_ = 0x3f8000003f800000;
        auVar1._0_8_ = 0x3f8000003f800000;
        _local_208 = minps(auVar3,auVar1);
        local_8 = local_158;
        local_18 = local_208;
        uStack_10 = uStack_200;
        *(undefined1 (*) [8])local_158 = local_208;
        *(undefined8 *)(local_158 + 2) = uStack_200;
        local_158 = local_158 + 4;
        fStack_114 = local_118;
        fStack_110 = local_118;
        fStack_10c = local_118;
        local_108 = local_118;
        fStack_f4 = local_f8;
        fStack_f0 = local_f8;
        fStack_ec = local_f8;
        local_dc = local_f8;
        local_68 = local_1f8;
        uStack_60 = uStack_1f0;
        local_58 = local_1c8;
        uStack_50 = uStack_1c0;
        local_38 = local_1d8;
        uStack_30 = uStack_1d0;
      }
    }
  }
  else {
    for (local_20c = 0; local_20c < local_144; local_20c = local_20c + 1) {
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                         (int)((ulong)in_RDI >> 0x20));
      pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_260);
      ncnn::Mat::~Mat((Mat *)0x8e9abd);
      local_218 = pfVar2;
      for (in_stack_fffffffffffffd9c = 0; in_stack_fffffffffffffd9c < local_148;
          in_stack_fffffffffffffd9c = in_stack_fffffffffffffd9c + 1) {
        if (*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) <= *local_218) {
          pfVar2 = (float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
          if (*local_218 < *pfVar2 || *local_218 == *pfVar2) {
            *local_218 = *local_218 * *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
                         *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          }
          else {
            *local_218 = 1.0;
          }
        }
        else {
          *local_218 = 0.0;
        }
        local_218 = local_218 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int HardSigmoid_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _zero = _mm256_set1_ps(0.f);
            __m256 _one = _mm256_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ans = _mm256_set1_ps(beta);
                _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
                _ans = _mm256_max_ps(_ans, _zero);
                _ans = _mm256_min_ps(_ans, _one);
                _mm256_storeu_ps(ptr, _ans);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _zero = _mm_set1_ps(0.f);
            __m128 _one = _mm_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _ans = _mm_set1_ps(beta);
                _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
                _ans = _mm_max_ps(_ans, _zero);
                _ans = _mm_min_ps(_ans, _one);
                _mm_storeu_ps(ptr, _ans);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __AVX__
        __m256 _zero = _mm256_set1_ps(0.f);
        __m256 _one = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero);
            _ans = _mm256_min_ps(_ans, _one);
            _mm256_storeu_ps(ptr, _ans);

            ptr += 8;
        }
#endif
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                *ptr = 1.f;
            else
                *ptr = *ptr * alpha + beta;
            ++ptr;
        }
    }

    return 0;
}